

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_server.h
# Opt level: O0

void __thiscall
blcl::net::server_interface<MsgType>::~server_interface(server_interface<MsgType> *this)

{
  server_interface<MsgType> *this_local;
  
  ~server_interface(this);
  operator_delete(this,0x1a0);
  return;
}

Assistant:

virtual ~server_interface() {
            stop();
        }